

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O2

void LoadTriangles(Level *NewLev,int radius)

{
  Material *pMVar1;
  Edge *pEVar2;
  int iVar3;
  int iVar4;
  Triangle *t;
  Edge *pEVar5;
  long lVar6;
  Material **ppMVar7;
  long lVar8;
  
  ExpectToken(TK_OPENBRACE);
  do {
    GetToken();
    if (Token.Type != TK_OPENBRACE) {
      if (Token.Type != TK_CLOSEBRACE) {
        Error = 1;
      }
      return;
    }
    t = NewTriangle();
    GetVert(NewLev,t,0);
    ExpectToken(TK_COMMA);
    GetVert(NewLev,t,1);
    ExpectToken(TK_COMMA);
    GetVert(NewLev,t,2);
    ExpectToken(TK_COMMA);
    ExpectToken(TK_NUMBER);
    ppMVar7 = &NewLev->AllMats;
    iVar3 = Token.IQuantity + -1;
    do {
      iVar4 = iVar3;
      pMVar1 = *ppMVar7;
      t->Material = pMVar1;
      if (pMVar1 == (Material *)0x0) {
        if (iVar4 != -2) {
          Error = 1;
          snprintf(ErrorText,0x400,"Unknown material referenced at line %d",(ulong)(uint)Lines);
          return;
        }
        break;
      }
      ppMVar7 = &pMVar1->Next;
      iVar3 = iVar4 + -1;
      Token.IQuantity = iVar4;
    } while (iVar4 + -1 != -2);
    ExpectToken(TK_CLOSEBRACE);
    t->Next = NewLev->AllTris;
    NewLev->AllTris = t;
    for (lVar8 = 0; lVar8 != -3; lVar8 = lVar8 + -1) {
      if ((*(byte *)((long)t->EdgeFlags + lVar8 * 4 + 9) & 1) != 0) {
        pEVar2 = NewLev->AllEdges;
        pEVar5 = NewEdge();
        NewLev->AllEdges = pEVar5;
        pEVar5->Material = t->Material;
        pEVar5->Next = pEVar2;
        pEVar5->EndPoints[0] = t->Edges[lVar8 + 2];
        lVar6 = lVar8 + 3;
        if (lVar8 == 0) {
          lVar6 = 0;
        }
        NewLev->AllEdges->EndPoints[1] = t->Edges[lVar6];
        pEVar2 = NewLev->AllEdges;
        GetNormal(pEVar2,pEVar2->EndPoints[0]->Pos,pEVar2->EndPoints[1]->Pos);
        pEVar2->c = (pEVar2->a * pEVar2->a + pEVar2->b * pEVar2->b) * -(double)radius + pEVar2->c;
        pEVar2->EndPoints[0]->Edges[pEVar2->EndPoints[0]->Edges[0] != (Edge *)0x0] = pEVar2;
        pEVar2->EndPoints[1]->Edges[pEVar2->EndPoints[1]->Edges[0] != (Edge *)0x0] = pEVar2;
      }
    }
  } while( true );
}

Assistant:

void LoadTriangles(struct Level *NewLev, int radius)
{
   struct Triangle *Tri;
   struct Edge *NextEdge;
   int c;

   ExpectToken(TK_OPENBRACE);
   while (1) {
      GetToken();
      switch (Token.Type) {
         case TK_CLOSEBRACE:
            return;
         case TK_OPENBRACE:
            {
               Tri = NewTriangle();

               /* read vertex pointers & edge flags */
               GetVert(NewLev, Tri, 0);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 1);
               ExpectToken(TK_COMMA);
               GetVert(NewLev, Tri, 2);
               ExpectToken(TK_COMMA);

               /* read material reference and store correct pointer */
               ExpectToken(TK_NUMBER);

               Tri->Material = NewLev->AllMats;
               while (Tri->Material && Token.IQuantity--)
                  Tri->Material = Tri->Material->Next;
               if (Token.IQuantity != -1) {
                  Error = 1;
                  snprintf(ErrorText, sizeof(ErrorText),
                            "Unknown material referenced at line %d", Lines);
                  return;
               }

               /* expect end of this triangle */
               ExpectToken(TK_CLOSEBRACE);

               /* insert new triangle into total level list */
               Tri->Next = NewLev->AllTris;
               NewLev->AllTris = Tri;

               /* generate edges */
               c = 3;
               while (c--) {
                  if (Tri->EdgeFlags[c] & FLAGS_COLLIDABLE) {
                     NextEdge = NewLev->AllEdges;
                     NewLev->AllEdges = NewEdge();
                     NewLev->AllEdges->Material = Tri->Material;
                     NewLev->AllEdges->Next = NextEdge;

                     NewLev->AllEdges->EndPoints[0] = Tri->Edges[c];
                     NewLev->AllEdges->EndPoints[1] = Tri->Edges[(c + 1) % 3];

                     InitEdge(NewLev->AllEdges, radius);
                  }
               }
            }
            break;
         default:
            Error = 1;
            return;
      }
   }
}